

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Meta * __thiscall spirv_cross::ParsedIR::find_meta(ParsedIR *this,ID id)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
  local_28;
  const_iterator itr;
  ParsedIR *this_local;
  Meta *pMStack_10;
  ID id_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
             )(_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
               )this;
  this_local._4_4_ = id.id;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
       ::find(&this->meta,(key_type *)((long)&this_local + 4));
  local_30._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,spirv_cross::Meta,std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)0>const,spirv_cross::Meta>>>>
                 (&this->meta);
  bVar1 = ::std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_false,_true>
                           *)&local_28);
    pMStack_10 = &pvVar2->second;
  }
  else {
    pMStack_10 = (Meta *)0x0;
  }
  return pMStack_10;
}

Assistant:

const Meta *ParsedIR::find_meta(ID id) const
{
	auto itr = meta.find(id);
	if (itr != end(meta))
		return &itr->second;
	else
		return nullptr;
}